

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputLCase2::Run(BasicInputLCase2 *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLuint i;
  GLuint index;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  for (index = 0; index != 8; index = index + 1) {
    glu::CallLogWrapper::glVertexAttribL4d(this_00,index,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x60,(void *)0x0,0x88e4);
  local_58 = 0x3ff0000000000000;
  uStack_50 = 0x4000000000000000;
  local_48 = 0x4008000000000000;
  uStack_40 = 0x4010000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x20,&local_58);
  local_58 = 0x4014000000000000;
  uStack_50 = 0x4018000000000000;
  local_48 = 0x401c000000000000;
  uStack_40 = 0x4020000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,0x20,&local_58);
  local_58 = 0x4022000000000000;
  uStack_50 = 0x4024000000000000;
  local_48 = 0x4026000000000000;
  uStack_40 = 0x4028000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x40,0x20,&local_58);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x60,(void *)0x0,0x88e4);
  local_58 = 0x4024000000000000;
  uStack_50 = 0x4034000000000000;
  local_48 = 0x403e000000000000;
  uStack_40 = 0x4044000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x20,&local_58);
  local_58 = 0x4049000000000000;
  uStack_50 = 0x404e000000000000;
  local_48 = 0x4051800000000000;
  uStack_40 = 0x4054000000000000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,0x20,&local_58);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,0,4,0x140a,0);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,2,4,0x140a,0);
  glu::CallLogWrapper::glVertexAttribLFormat(this_00,4,2,0x140a,8);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,4,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,0x20);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_vbo[0],0,0x20);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,2,this->m_vbo[1],8,0x10);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,1,1);
  (this->super_BasicInputLBase).instance_count = 2;
  (this->super_BasicInputLBase).expected_data[0].m_data[0] = 1.0;
  (this->super_BasicInputLBase).expected_data[0].m_data[1] = 2.0;
  (this->super_BasicInputLBase).expected_data[0].m_data[2] = 3.0;
  (this->super_BasicInputLBase).expected_data[0].m_data[3] = 4.0;
  (this->super_BasicInputLBase).expected_data[2].m_data[0] = 1.0;
  (this->super_BasicInputLBase).expected_data[2].m_data[1] = 2.0;
  (this->super_BasicInputLBase).expected_data[2].m_data[2] = 3.0;
  (this->super_BasicInputLBase).expected_data[2].m_data[3] = 4.0;
  (this->super_BasicInputLBase).expected_data[4].m_data[0] = 30.0;
  (this->super_BasicInputLBase).expected_data[4].m_data[1] = 40.0;
  (this->super_BasicInputLBase).expected_data[4].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[4].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[0] = 5.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[1] = 6.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[2] = 7.0;
  (this->super_BasicInputLBase).expected_data[8].m_data[3] = 8.0;
  (this->super_BasicInputLBase).expected_data[10].m_data[0] = 1.0;
  (this->super_BasicInputLBase).expected_data[10].m_data[1] = 2.0;
  (this->super_BasicInputLBase).expected_data[10].m_data[2] = 3.0;
  (this->super_BasicInputLBase).expected_data[10].m_data[3] = 4.0;
  (this->super_BasicInputLBase).expected_data[0xc].m_data[0] = 50.0;
  (this->super_BasicInputLBase).expected_data[0xc].m_data[1] = 60.0;
  (this->super_BasicInputLBase).expected_data[0xc].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0xc].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0x10].m_data[0] = 1.0;
  (this->super_BasicInputLBase).expected_data[0x10].m_data[1] = 2.0;
  (this->super_BasicInputLBase).expected_data[0x10].m_data[2] = 3.0;
  (this->super_BasicInputLBase).expected_data[0x10].m_data[3] = 4.0;
  (this->super_BasicInputLBase).expected_data[0x12].m_data[0] = 5.0;
  (this->super_BasicInputLBase).expected_data[0x12].m_data[1] = 6.0;
  (this->super_BasicInputLBase).expected_data[0x12].m_data[2] = 7.0;
  (this->super_BasicInputLBase).expected_data[0x12].m_data[3] = 8.0;
  (this->super_BasicInputLBase).expected_data[0x14].m_data[0] = 30.0;
  (this->super_BasicInputLBase).expected_data[0x14].m_data[1] = 40.0;
  (this->super_BasicInputLBase).expected_data[0x14].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0x14].m_data[3] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0x18].m_data[0] = 5.0;
  (this->super_BasicInputLBase).expected_data[0x18].m_data[1] = 6.0;
  (this->super_BasicInputLBase).expected_data[0x18].m_data[2] = 7.0;
  (this->super_BasicInputLBase).expected_data[0x18].m_data[3] = 8.0;
  (this->super_BasicInputLBase).expected_data[0x1a].m_data[0] = 5.0;
  (this->super_BasicInputLBase).expected_data[0x1a].m_data[1] = 6.0;
  (this->super_BasicInputLBase).expected_data[0x1a].m_data[2] = 7.0;
  (this->super_BasicInputLBase).expected_data[0x1a].m_data[3] = 8.0;
  (this->super_BasicInputLBase).expected_data[0x1c].m_data[0] = 50.0;
  (this->super_BasicInputLBase).expected_data[0x1c].m_data[1] = 60.0;
  (this->super_BasicInputLBase).expected_data[0x1c].m_data[2] = 12345.0;
  (this->super_BasicInputLBase).expected_data[0x1c].m_data[3] = 12345.0;
  lVar1 = BasicInputLBase::Run(&this->super_BasicInputLBase);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribL4d(i, 0.0, 0.0, 0.0, 0.0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(DVec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(DVec4), &DVec4(1.0, 2.0, 3.0, 4.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(DVec4), &DVec4(5.0, 6.0, 7.0, 8.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 64, sizeof(DVec4), &DVec4(9.0, 10.0, 11.0, 12.0)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(DVec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(DVec4), &DVec4(10.0, 20.0, 30.0, 40.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(DVec4), &DVec4(50.0, 60.0, 70.0, 80.0)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribLFormat(0, 4, GL_DOUBLE, 0);
		glVertexAttribLFormat(2, 4, GL_DOUBLE, 0);
		glVertexAttribLFormat(4, 2, GL_DOUBLE, 8);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(4, 2);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(0, m_vbo[0], 0, 32);
		glBindVertexBuffer(1, m_vbo[0], 0, 32);
		glBindVertexBuffer(2, m_vbo[1], 8, 16);
		glVertexBindingDivisor(1, 1);

		instance_count		 = 2;
		expected_data[0]	 = DVec4(1.0, 2.0, 3.0, 4.0);
		expected_data[2]	 = DVec4(1.0, 2.0, 3.0, 4.0);
		expected_data[4]	 = DVec4(30.0, 40.0, 12345.0, 12345.0);
		expected_data[0 + 8] = DVec4(5.0, 6.0, 7.0, 8.0);
		expected_data[2 + 8] = DVec4(1.0, 2.0, 3.0, 4.0);
		expected_data[4 + 8] = DVec4(50.0, 60.0, 12345.0, 12345.0);

		expected_data[0 + 16]	 = DVec4(1.0, 2.0, 3.0, 4.0);
		expected_data[2 + 16]	 = DVec4(5.0, 6.0, 7.0, 8.0);
		expected_data[4 + 16]	 = DVec4(30.0, 40.0, 12345.0, 12345.0);
		expected_data[0 + 8 + 16] = DVec4(5.0, 6.0, 7.0, 8.0);
		expected_data[2 + 8 + 16] = DVec4(5.0, 6.0, 7.0, 8.0);
		expected_data[4 + 8 + 16] = DVec4(50.0, 60.0, 12345.0, 12345.0);
		return BasicInputLBase::Run();
	}